

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdialog.cpp
# Opt level: O0

void __thiscall QFontDialogPrivate::QFontDialogPrivate(QFontDialogPrivate *this)

{
  QDialogPrivate *in_RDI;
  
  QDialogPrivate::QDialogPrivate(in_RDI);
  *(undefined ***)&in_RDI->super_QWidgetPrivate = &PTR__QFontDialogPrivate_00d243e0;
  QString::QString((QString *)0x791d7b);
  *(undefined4 *)&in_RDI[1].super_QWidgetPrivate.graphicsEffect = 0;
  QString::QString((QString *)0x791d96);
  QFont::QFont((QFont *)&in_RDI[1].super_QWidgetPrivate.toolTip.d.ptr);
  QFontDialogOptions::create();
  QPointer<QObject>::QPointer((QPointer<QObject> *)0x791dc9);
  QByteArray::QByteArray((QByteArray *)0x791dda);
  return;
}

Assistant:

QFontDialogPrivate::QFontDialogPrivate()
    : writingSystem(QFontDatabase::Any),
      options(QFontDialogOptions::create())
{
}